

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error asmjit::v1_14::BaseBuilder_newLabelInternal(BaseBuilder *self,uint32_t labelId)

{
  ZoneVector<asmjit::v1_14::LabelNode_*> *this;
  LabelNode *pLVar1;
  Error EVar2;
  LabelNode **ppLVar3;
  LabelNode *node;
  uint32_t local_2c;
  LabelNode *local_28;
  
  local_2c = labelId;
  if (labelId + 1 <= *(uint *)&self->field_0x190) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0x1bb,"self->_labelNodes.size() < labelId + 1");
  }
  this = &self->_labelNodes;
  EVar2 = ZoneVector<asmjit::v1_14::LabelNode_*>::willGrow
                    (this,&self->_allocator,labelId - *(uint *)&self->field_0x190);
  if (EVar2 == 0) {
    EVar2 = BaseBuilder::_newNodeT<asmjit::v1_14::LabelNode,unsigned_int&>(self,&local_28,&local_2c)
    ;
    if (EVar2 == 0) {
      ZoneVector<asmjit::v1_14::LabelNode_*>::resize(this,&self->_allocator,local_2c + 1);
      pLVar1 = local_28;
      ppLVar3 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[](this,(ulong)local_2c);
      *ppLVar3 = pLVar1;
      *(uint32_t *)(local_28 + 0x30) = local_2c;
    }
    return EVar2;
  }
  EVar2 = BaseEmitter::reportError(&self->super_BaseEmitter,EVar2,(char *)0x0);
  return EVar2;
}

Assistant:

static Error BaseBuilder_newLabelInternal(BaseBuilder* self, uint32_t labelId) {
  ASMJIT_ASSERT(self->_labelNodes.size() < labelId + 1);

  uint32_t growBy = labelId - self->_labelNodes.size();
  Error err = self->_labelNodes.willGrow(&self->_allocator, growBy);

  if (ASMJIT_UNLIKELY(err))
    return self->reportError(err);

  LabelNode* node;
  ASMJIT_PROPAGATE(self->_newNodeT<LabelNode>(&node, labelId));

  self->_labelNodes.resize(&self->_allocator, labelId + 1);
  self->_labelNodes[labelId] = node;
  node->_labelId = labelId;
  return kErrorOk;
}